

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_node_min_angle(REF_GRID ref_grid,REF_INT node,REF_DBL *angle)

{
  int iVar1;
  int iVar2;
  REF_NODE pRVar3;
  REF_CELL pRVar4;
  REF_ADJ pRVar5;
  REF_INT *pRVar6;
  REF_DBL *pRVar7;
  int iVar8;
  uint uVar9;
  REF_ADJ_ITEM pRVar10;
  long lVar11;
  ulong uVar12;
  undefined8 uVar13;
  int iVar14;
  char *pcVar15;
  int iVar16;
  int iVar17;
  double __x;
  double dVar18;
  double dVar19;
  REF_DBL RVar20;
  REF_DBL dx2 [3];
  REF_DBL dx1 [3];
  
  pRVar3 = ref_grid->node;
  pRVar4 = ref_grid->cell[0];
  *angle = 180.0;
  uVar12 = 0xffffffff;
  iVar14 = -1;
  if (-1 < node) {
    pRVar5 = pRVar4->ref_adj;
    uVar12 = 0xffffffff;
    iVar14 = -1;
    if (node < pRVar5->nnode) {
      uVar9 = pRVar5->first[(uint)node];
      uVar12 = 0xffffffff;
      iVar14 = -1;
      if ((long)(int)uVar9 != -1) {
        iVar14 = pRVar5->item[(int)uVar9].ref;
        uVar12 = (ulong)uVar9;
      }
    }
  }
LAB_001553c7:
  if ((int)uVar12 == -1) {
    return 0;
  }
  iVar8 = -1;
  iVar16 = -1;
  if (node < 0) goto LAB_0015540e;
  pRVar5 = pRVar4->ref_adj;
  iVar8 = -1;
  if (pRVar5->nnode <= node) goto LAB_0015540e;
  iVar17 = pRVar5->first[(uint)node];
  iVar8 = -1;
  if (iVar17 == -1) goto LAB_0015540e;
  pRVar10 = pRVar5->item;
  do {
    iVar8 = pRVar10[iVar17].ref;
    iVar16 = iVar17;
LAB_0015540e:
    do {
      if (iVar16 == -1) {
        pRVar10 = pRVar4->ref_adj->item;
        uVar12 = (ulong)pRVar10[(int)uVar12].next;
        iVar14 = -1;
        if (uVar12 != 0xffffffffffffffff) {
          iVar14 = pRVar10[uVar12].ref;
        }
        goto LAB_001553c7;
      }
      if (iVar14 != iVar8) {
        pRVar6 = pRVar4->c2n;
        lVar11 = (long)(pRVar4->size_per * iVar14);
        iVar17 = pRVar6[lVar11];
        iVar1 = pRVar6[lVar11 + 1];
        lVar11 = (long)(iVar8 * pRVar4->size_per);
        iVar8 = pRVar6[lVar11];
        iVar2 = pRVar6[lVar11 + 1];
        pRVar7 = pRVar3->real;
        for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
          dx1[lVar11] = pRVar7[((iVar17 - node) + iVar1) * 0xf + lVar11] -
                        pRVar7[node * 0xf + lVar11];
          dx2[lVar11] = pRVar7[((iVar8 - node) + iVar2) * 0xf + lVar11] -
                        pRVar7[node * 0xf + lVar11];
        }
        uVar9 = ref_math_normalize(dx1);
        if (uVar9 != 0) {
          pcVar15 = "dx1";
          uVar13 = 0xa5c;
LAB_001555f6:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 uVar13,"ref_geom_node_min_angle",(ulong)uVar9,pcVar15);
          return uVar9;
        }
        uVar9 = ref_math_normalize(dx2);
        if (uVar9 != 0) {
          pcVar15 = "dx2";
          uVar13 = 0xa5d;
          goto LAB_001555f6;
        }
        __x = dx1[2] * dx2[2] + dx1[0] * dx2[0] + dx1[1] * dx2[1];
        dVar19 = *angle;
        dVar18 = acos(__x);
        if ((dVar18 * 180.0) / 3.14159265358979 <= dVar19) {
          dVar19 = acos(__x);
          RVar20 = (dVar19 * 180.0) / 3.14159265358979;
        }
        else {
          RVar20 = *angle;
        }
        *angle = RVar20;
      }
      pRVar10 = pRVar4->ref_adj->item;
      iVar17 = pRVar10[iVar16].next;
      iVar8 = -1;
      iVar16 = iVar17;
    } while (iVar17 == -1);
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_geom_node_min_angle(REF_GRID ref_grid,
                                                  REF_INT node,
                                                  REF_DBL *angle) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_edg(ref_grid);
  REF_INT item1, cell1, node1;
  REF_INT item2, cell2, node2;
  REF_INT i;
  REF_DBL dot, dx1[3], dx2[3];
  *angle = 180.0;
  each_ref_cell_having_node(ref_cell, node, item1, cell1) {
    each_ref_cell_having_node(ref_cell, node, item2, cell2) {
      if (cell1 == cell2) continue; /* skip same edge */
      node1 = ref_cell_c2n(ref_cell, 0, cell1) +
              ref_cell_c2n(ref_cell, 1, cell1) - node;
      node2 = ref_cell_c2n(ref_cell, 0, cell2) +
              ref_cell_c2n(ref_cell, 1, cell2) - node;
      for (i = 0; i < 3; i++) {
        dx1[i] =
            ref_node_xyz(ref_node, i, node1) - ref_node_xyz(ref_node, i, node);
        dx2[i] =
            ref_node_xyz(ref_node, i, node2) - ref_node_xyz(ref_node, i, node);
      }
      RSS(ref_math_normalize(dx1), "dx1");
      RSS(ref_math_normalize(dx2), "dx2");
      dot = ref_math_dot(dx1, dx2);
      *angle = MIN(*angle, ref_math_in_degrees(acos(dot)));
    }
  }
  return REF_SUCCESS;
}